

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MergingAlgorithm.cpp
# Opt level: O1

void __thiscall van_kampen::MergingAlgorithm::MergingAlgorithm(MergingAlgorithm *this)

{
  undefined1 local_29;
  shared_ptr<van_kampen::Graph> local_28;
  
  (this->super_DiagrammGeneratingAlgorithm)._vptr_DiagrammGeneratingAlgorithm =
       (_func_int **)&PTR___cxa_pure_virtual_00164c00;
  (this->super_DiagrammGeneratingAlgorithm).graph_.
  super___shared_ptr<van_kampen::Graph,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<van_kampen::Graph,std::allocator<van_kampen::Graph>>
            (&(this->super_DiagrammGeneratingAlgorithm).graph_.
              super___shared_ptr<van_kampen::Graph,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (Graph **)&(this->super_DiagrammGeneratingAlgorithm).graph_,
             (allocator<van_kampen::Graph> *)&local_29);
  (this->super_DiagrammGeneratingAlgorithm)._vptr_DiagrammGeneratingAlgorithm =
       (_func_int **)&PTR_generate_00164cc8;
  this->limit = 0;
  this->quiet = false;
  local_28.super___shared_ptr<van_kampen::Graph,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->super_DiagrammGeneratingAlgorithm).graph_.
       super___shared_ptr<van_kampen::Graph,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_28.super___shared_ptr<van_kampen::Graph,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->super_DiagrammGeneratingAlgorithm).graph_.
       super___shared_ptr<van_kampen::Graph,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_28.super___shared_ptr<van_kampen::Graph,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_28.super___shared_ptr<van_kampen::Graph,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_28.super___shared_ptr<van_kampen::Graph,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_28.super___shared_ptr<van_kampen::Graph,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_28.super___shared_ptr<van_kampen::Graph,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  Diagramm::Diagramm(&this->result_,&local_28);
  if (local_28.super___shared_ptr<van_kampen::Graph,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.super___shared_ptr<van_kampen::Graph,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

MergingAlgorithm::MergingAlgorithm()
    : result_(graph_) {}